

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

Abc_Cex_t * Cec_SplitDeriveModel(Gia_Man_t *p,Cnf_Dat_t *pCnf,sat_solver *pSat)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int *pArray;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pAVar4;
  Vec_Int_t *p_00;
  int iVar5;
  long lVar6;
  
  iVar2 = p->vCis->nSize;
  iVar5 = p->nRegs;
  pArray = (int *)calloc((long)(iVar2 - iVar5),4);
  for (lVar6 = 0; lVar6 < iVar2 - iVar5; lVar6 = lVar6 + 1) {
    pObj = Gia_ManCi(p,(int)lVar6);
    if (pObj == (Gia_Obj_t *)0x0) break;
    piVar1 = pCnf->pVarNums;
    iVar2 = Gia_ObjId(p,pObj);
    iVar2 = piVar1[iVar2];
    if (((long)iVar2 < 0) || (pSat->size <= iVar2)) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0xda,"int sat_solver_var_value(sat_solver *, int)");
    }
    pArray[lVar6] = (uint)(pSat->model[iVar2] == 1);
    iVar2 = p->vCis->nSize;
    iVar5 = p->nRegs;
  }
  p_00 = p->vCofVars;
  if (p_00 != (Vec_Int_t *)0x0) {
    for (iVar2 = 0; iVar2 < p_00->nSize; iVar2 = iVar2 + 1) {
      uVar3 = Vec_IntEntry(p_00,iVar2);
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      pArray[uVar3 >> 1] = ~uVar3 & 1;
      p_00 = p->vCofVars;
    }
  }
  pAVar4 = Abc_CexCreate(0,p->vCis->nSize - p->nRegs,pArray,0,0,0);
  free(pArray);
  return pAVar4;
}

Assistant:

Abc_Cex_t * Cec_SplitDeriveModel( Gia_Man_t * p, Cnf_Dat_t * pCnf, sat_solver * pSat )
{
    Abc_Cex_t * pCex;
    Gia_Obj_t * pObj;
    int i, iLit, * pModel;
    pModel = ABC_CALLOC( int, Gia_ManPiNum(p) );
    Gia_ManForEachPi( p, pObj, i )
        pModel[i] = sat_solver_var_value(pSat, pCnf->pVarNums[Gia_ObjId(p, pObj)]);
    if ( p->vCofVars )
        Vec_IntForEachEntry( p->vCofVars, iLit, i )
            pModel[Abc_Lit2Var(iLit)] = !Abc_LitIsCompl(iLit);
    pCex = Abc_CexCreate( 0, Gia_ManPiNum(p), pModel, 0, 0, 0 );
    ABC_FREE( pModel );
    return pCex;
}